

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ChainPromiseNode::setSelfPointer(ChainPromiseNode *this,Own<kj::_::PromiseNode> *selfPtr)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  if (*(int *)&(this->super_Event).field_0x24 == 1) {
    pDVar1 = selfPtr->disposer;
    pPVar2 = selfPtr->ptr;
    uVar3 = *(undefined4 *)((long)&(this->inner).disposer + 4);
    uVar4 = *(undefined4 *)&(this->inner).ptr;
    uVar5 = *(undefined4 *)((long)&(this->inner).ptr + 4);
    *(undefined4 *)&selfPtr->disposer = *(undefined4 *)&(this->inner).disposer;
    *(undefined4 *)((long)&selfPtr->disposer + 4) = uVar3;
    *(undefined4 *)&selfPtr->ptr = uVar4;
    *(undefined4 *)((long)&selfPtr->ptr + 4) = uVar5;
    (this->inner).ptr = (PromiseNode *)0x0;
    if (pPVar2 != (PromiseNode *)0x0) {
      (**pDVar1->_vptr_Disposer)
                (pDVar1,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
    }
    (*selfPtr->ptr->_vptr_PromiseNode[1])(selfPtr->ptr,selfPtr);
    return;
  }
  this->selfPtr = selfPtr;
  return;
}

Assistant:

void ChainPromiseNode::setSelfPointer(Own<PromiseNode>* selfPtr) noexcept {
  if (state == STEP2) {
    *selfPtr = kj::mv(inner);  // deletes this!
    selfPtr->get()->setSelfPointer(selfPtr);
  } else {
    this->selfPtr = selfPtr;
  }
}